

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall
ear::Layout::Layout(Layout *this,string *name,
                   vector<ear::Channel,_std::allocator<ear::Channel>_> *channels,
                   optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *screen)

{
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *screen_local;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *channels_local;
  string *name_local;
  Layout *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector(&this->_channels,channels);
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::optional
            (&this->_screen,screen);
  return;
}

Assistant:

Layout::Layout(std::string name, std::vector<Channel> channels,
                 boost::optional<Screen> screen)
      : _name(std::move(name)),
        _channels(std::move(channels)),
        _screen(screen){}